

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
wabt::MakeUnique<wabt::CallIndirectExpr>(void)

{
  CallIndirectExpr *this;
  __uniq_ptr_data<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>,_true,_true>
  in_RDI;
  Location local_30;
  
  this = (CallIndirectExpr *)operator_new(0xc0);
  Location::Location(&local_30);
  CallIndirectExpr::CallIndirectExpr(this,&local_30);
  std::unique_ptr<wabt::CallIndirectExpr,std::default_delete<wabt::CallIndirectExpr>>::
  unique_ptr<std::default_delete<wabt::CallIndirectExpr>,void>
            ((unique_ptr<wabt::CallIndirectExpr,std::default_delete<wabt::CallIndirectExpr>> *)
             in_RDI.
             super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>
             .super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>,_true,_true>
          )(tuple<wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>)
           in_RDI.
           super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>
           .super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}